

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

_Bool M68K_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                         uint64_t address,void *inst_info)

{
  cs_m68k *op;
  uint8_t uVar1;
  cs_mode cVar2;
  cs_struct *pcVar3;
  m68k_info *info;
  cs_detail *__s;
  _func_void_m68k_info_ptr *p_Var4;
  _Bool _Var5;
  int iVar6;
  opcode_struct *poVar7;
  long lVar8;
  uint uVar9;
  MCInst *pMVar10;
  uint uVar11;
  uint16_t uVar12;
  uint *puVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  cs_m68k_op *op_00;
  _func_void_m68k_info_ptr *p_Var17;
  undefined1 auVar18 [16];
  
  if (code_len < 2) {
    uVar12 = 0;
    _Var5 = false;
  }
  else {
    pcVar3 = instr->csh;
    info = (m68k_info *)pcVar3->printer_info;
    __s = instr->flat_insn->detail;
    pMVar10 = instr;
    if (__s != (cs_detail *)0x0) {
      memset(__s,0,0x148);
    }
    info->groups_count = '\0';
    info->regs_read_count = '\0';
    info->regs_write_count = '\0';
    info->code = code;
    info->code_len = code_len;
    info->baseAddress = address;
    cVar2 = pcVar3->mode;
    auVar18._0_4_ = -(uint)((cVar2 & (CS_MODE_M680X_6808|CS_MODE_M680X_6805)) == CS_MODE_ARM);
    auVar18._4_4_ = -(uint)((cVar2 & CS_MODE_M680X_6801) == CS_MODE_ARM);
    auVar18._8_4_ = -(uint)((cVar2 & CS_MODE_64) == CS_MODE_ARM);
    auVar18._12_4_ = -(uint)((cVar2 & CS_MODE_32) == CS_MODE_ARM);
    uVar9 = movmskps((int)pMVar10,auVar18);
    uVar15 = 3;
    if ((uVar9 & 4) != 0) {
      uVar15 = (uint)((uVar9 & 8) == 0);
    }
    uVar11 = 4;
    if ((uVar9 & 2) != 0) {
      uVar11 = uVar15;
    }
    info->inst = instr;
    uVar16 = (uint)address;
    info->pc = uVar16;
    uVar15 = 5;
    if ((uVar9 & 1) != 0) {
      uVar15 = uVar11;
    }
    info->ir = 0;
    uVar9 = *(uint *)(&DAT_00587468 + (uVar15 << 2));
    info->type = *(uint *)(&DAT_00587450 + (uVar15 << 2));
    info->address_mask = uVar9;
    op = &info->extension;
    instr->Opcode = 0;
    if (g_instruction_table[0].instruction == (_func_void_m68k_info_ptr *)0x0) {
      uVar14 = 0;
      if (g_opcode_info[0].opcode_handler != (_func_void_m68k_info_ptr *)0x0) {
        poVar7 = g_opcode_info;
        do {
          poVar7 = poVar7 + 1;
          uVar15 = (int)uVar14 + 1;
          uVar14 = (ulong)uVar15;
        } while (poVar7->opcode_handler != (_func_void_m68k_info_ptr *)0x0);
        uVar14 = (ulong)uVar15;
      }
      qsort(g_opcode_info,uVar14,0x20,compare_nof_true_bits);
      p_Var4 = g_opcode_info[0].opcode_handler;
      uVar14 = 0;
      do {
        g_instruction_table[uVar14].instruction = d68000_invalid;
        if (p_Var4 != (_func_void_m68k_info_ptr *)0x0) {
          puVar13 = &g_opcode_info[0].mask;
          p_Var17 = p_Var4;
          do {
            if ((((*puVar13 & (uint)uVar14) == puVar13[1]) &&
                ((((p_Var17 != d68000_move_32 && (p_Var17 != d68000_move_8)) &&
                  (p_Var17 != d68000_move_16)) ||
                 (iVar6 = valid_ea((uint)(uVar14 >> 3) & 0x38 | (uint)(uVar14 >> 9) & 7,0xbf8),
                 iVar6 != 0)))) && (iVar6 = valid_ea((uint)uVar14,puVar13[2]), iVar6 != 0)) {
              g_instruction_table[uVar14].instruction = p_Var17;
              *(undefined8 *)&g_instruction_table[uVar14].word2_mask = *(undefined8 *)(puVar13 + 3);
              break;
            }
            p_Var17 = *(_func_void_m68k_info_ptr **)(puVar13 + 6);
            puVar13 = puVar13 + 8;
          } while (p_Var17 != (_func_void_m68k_info_ptr *)0x0);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != 0x10000);
    }
    memset(op,0,0xf0);
    (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
    lVar8 = 0x60;
    do {
      *(undefined4 *)((long)(info->extension).operands + lVar8 + -0x30) = 1;
      lVar8 = lVar8 + 0x38;
    } while (lVar8 != 0x140);
    uVar14 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
    uVar15 = 0xaaaa;
    if (uVar14 + 2 <= info->code_len) {
      uVar15 = (uint)(ushort)(*(ushort *)(info->code + uVar14) << 8 |
                             *(ushort *)(info->code + uVar14) >> 8);
    }
    info->ir = uVar15;
    uVar15 = peek_imm_32(info);
    iVar6 = instruction_is_valid(info,uVar15 & 0xffff);
    if (iVar6 != 0) {
      uVar14 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
      uVar15 = 0xaaaa;
      if (uVar14 + 2 <= info->code_len) {
        uVar15 = (uint)(ushort)(*(ushort *)(info->code + uVar14) << 8 |
                               *(ushort *)(info->code + uVar14) >> 8);
      }
      info->pc = info->pc + 2;
      info->ir = uVar15;
      (**(code **)((long)&g_instruction_table[0].instruction + (ulong)(uVar15 << 4)))(info);
    }
    uVar15 = info->pc;
    info->pc = uVar16;
    iVar6 = uVar15 - uVar16;
    if (iVar6 == 0) {
      _Var5 = false;
      uVar12 = 2;
    }
    else {
      uVar1 = (info->extension).op_count;
      if (uVar1 != '\0') {
        if (uVar1 == '\x01') {
          update_op_reg_list(info,op->operands,1);
        }
        else {
          update_op_reg_list(info,op->operands,0);
          if (1 < (info->extension).op_count) {
            op_00 = (info->extension).operands;
            uVar14 = 1;
            do {
              op_00 = op_00 + 1;
              update_op_reg_list(info,op_00,1);
              uVar14 = uVar14 + 1;
            } while (uVar14 < (info->extension).op_count);
          }
        }
      }
      uVar12 = (uint16_t)iVar6;
      if ((int)code_len < iVar6) {
        uVar12 = (uint16_t)code_len;
      }
      _Var5 = true;
    }
  }
  *size = uVar12;
  return _Var5;
}

Assistant:

bool M68K_getInstruction(csh ud, const uint8_t* code, size_t code_len, MCInst* instr, uint16_t* size, uint64_t address, void* inst_info)
{
#ifdef M68K_DEBUG
	SStream ss;
#endif
	int s;
	int cpu_type = M68K_CPU_TYPE_68000;
	cs_struct* handle = instr->csh;
	m68k_info *info = (m68k_info*)handle->printer_info;

	// code len has to be at least 2 bytes to be valid m68k

	if (code_len < 2) {
		*size = 0;
		return false;
	}

	if (instr->flat_insn->detail) {
		memset(instr->flat_insn->detail, 0, offsetof(cs_detail, m68k)+sizeof(cs_m68k));
	}

	info->groups_count = 0;
	info->regs_read_count = 0;
	info->regs_write_count = 0;
	info->code = code;
	info->code_len = code_len;
	info->baseAddress = address;

	if (handle->mode & CS_MODE_M68K_010)
		cpu_type = M68K_CPU_TYPE_68010;
	if (handle->mode & CS_MODE_M68K_020)
		cpu_type = M68K_CPU_TYPE_68020;
	if (handle->mode & CS_MODE_M68K_030)
		cpu_type = M68K_CPU_TYPE_68030;
	if (handle->mode & CS_MODE_M68K_040)
		cpu_type = M68K_CPU_TYPE_68040;
	if (handle->mode & CS_MODE_M68K_060)
		cpu_type = M68K_CPU_TYPE_68040;	// 060 = 040 for now

	m68k_setup_internals(info, instr, (unsigned int)address, cpu_type);
	s = m68k_disassemble(info, address);

	if (s == 0) {
		*size = 2;
		return false;
	}

	build_regs_read_write_counts(info);

#ifdef M68K_DEBUG
	SStream_Init(&ss);
	M68K_printInst(instr, &ss, info);
#endif

	// Make sure we always stay within range
	if (s > (int)code_len)
		*size = (uint16_t)code_len;
	else
		*size = (uint16_t)s;

	return true;
}